

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O2

CURLcode mqtt_do(Curl_easy *data,_Bool *done)

{
  char *pcVar1;
  curl_trc_feat *pcVar2;
  int iVar3;
  CURLcode CVar4;
  void *pvVar5;
  char *buf;
  size_t sVar6;
  long lVar7;
  size_t __n;
  char *pcVar8;
  ulong uVar9;
  char *__s;
  bool bVar10;
  curltime cVar11;
  char remain [4];
  undefined1 local_60 [5];
  undefined3 uStack_5b;
  undefined4 uStack_58;
  undefined1 uStack_54;
  char *local_50;
  ulong local_48;
  size_t local_40;
  size_t local_38;
  
  pvVar5 = Curl_meta_get(data,"meta:proto:mqtt:easy");
  *done = false;
  if (pvVar5 == (void *)0x0) {
    return CURLE_FAILED_INIT;
  }
  cVar11 = Curl_now();
  *(time_t *)((long)pvVar5 + 0x58) = cVar11.tv_sec;
  *(int *)((long)pvVar5 + 0x60) = cVar11.tv_usec;
  *(byte *)((long)pvVar5 + 0x69) = *(byte *)((long)pvVar5 + 0x69) & 0xfe;
  remain[0] = '\0';
  remain[1] = '\0';
  remain[2] = '\0';
  remain[3] = '\0';
  uStack_58 = 0;
  uStack_54 = 0;
  local_60 = (undefined1  [5])0x6c727563;
  uStack_5b = 0;
  pcVar8 = (data->state).aptr.user;
  if (pcVar8 == (char *)0x0) {
    pcVar8 = "";
  }
  local_38 = strlen(pcVar8);
  __s = (data->state).aptr.passwd;
  if (__s == (char *)0x0) {
    __s = "";
  }
  local_40 = strlen(__s);
  bVar10 = local_40 != 0;
  lVar7 = local_38 + local_40 + (ulong)(local_38 != 0) * 2;
  iVar3 = mqtt_encode_len(remain,lVar7 + (ulong)bVar10 * 2 + 0x18);
  __n = (size_t)iVar3;
  uVar9 = lVar7 + (ulong)bVar10 * 2 + __n + 0x19;
  if (0xfffffff < uVar9) {
    CVar4 = CURLE_WEIRD_SERVER_REPLY;
    goto LAB_00141e4e;
  }
  buf = (char *)(*Curl_ccalloc)(1,uVar9);
  if (buf == (char *)0x0) {
    CVar4 = CURLE_OUT_OF_MEMORY;
    goto LAB_00141e4e;
  }
  *buf = '\x10';
  local_48 = uVar9;
  memcpy(buf + 1,remain,__n);
  pcVar1 = buf + __n + 1;
  pcVar1[0] = '\0';
  pcVar1[1] = '\x04';
  pcVar1[2] = 'M';
  pcVar1[3] = 'Q';
  pcVar1[4] = 'T';
  pcVar1[5] = 'T';
  pcVar1[6] = '\x04';
  pcVar1[7] = '\x02';
  (buf + __n + 9)[0] = '\0';
  (buf + __n + 9)[1] = '<';
  CVar4 = Curl_rand_alnum(data,local_60 + 4,9);
  sVar6 = strlen(local_60);
  if (sVar6 == 0xc) {
    local_50 = buf + __n;
    local_50[0xb] = '\0';
    local_50[0xc] = '\f';
    *(undefined4 *)(local_50 + 0x15) = uStack_58;
    *(ulong *)(local_50 + 0xd) = CONCAT35(uStack_5b,local_60);
    if ((((data->set).field_0x89f & 0x40) != 0) &&
       ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      Curl_infof(data,"Using client id \'%s\'",local_60);
    }
    lVar7 = local_38 + __n + 0x19;
    if (local_38 == 0) {
LAB_00141da9:
      if (local_40 != 0) {
        if (0xffff < local_40) {
          pcVar8 = "Password too long: [%zu]";
          goto LAB_00141dc3;
        }
        local_50[8] = local_50[8] | 0x40;
        buf[lVar7] = (char)(local_40 >> 8);
        buf[lVar7 + 1] = (char)local_40;
        memcpy(buf + lVar7 + 2,__s,local_40);
      }
      if (CVar4 == CURLE_OK) {
        CVar4 = mqtt_send(data,buf,local_48);
      }
    }
    else {
      if (local_38 < 0x10000) {
        local_50[8] = local_50[8] | 0x80;
        lVar7 = local_38 + __n + 0x1b;
        buf[__n + 0x19] = (char)(local_38 >> 8);
        buf[__n + 0x1a] = (char)local_38;
        memcpy(buf + __n + 0x1b,pcVar8,local_38);
        goto LAB_00141da9;
      }
      pcVar8 = "Username too long: [%zu]";
LAB_00141dc3:
      Curl_failf(data,pcVar8);
      CVar4 = CURLE_WEIRD_SERVER_REPLY;
    }
  }
  else {
    Curl_failf(data,"Client ID length mismatched: [%zu]",sVar6);
    CVar4 = CURLE_WEIRD_SERVER_REPLY;
  }
  (*Curl_cfree)(buf);
  (*Curl_cfree)((data->state).aptr.user);
  (data->state).aptr.user = (char *)0x0;
  (*Curl_cfree)((data->state).aptr.passwd);
  (data->state).aptr.passwd = (char *)0x0;
  if (CVar4 == CURLE_OK) {
    mqstate(data,MQTT_FIRST,MQTT_CONNACK);
    return CURLE_OK;
  }
LAB_00141e4e:
  Curl_failf(data,"Error %d sending MQTT CONNECT request",(ulong)CVar4);
  return CVar4;
}

Assistant:

static CURLcode mqtt_do(struct Curl_easy *data, bool *done)
{
  struct MQTT *mq = Curl_meta_get(data, CURL_META_MQTT_EASY);
  CURLcode result = CURLE_OK;
  *done = FALSE; /* unconditionally */

  if(!mq)
    return CURLE_FAILED_INIT;
  mq->lastTime = Curl_now();
  mq->pingsent = FALSE;

  result = mqtt_connect(data);
  if(result) {
    failf(data, "Error %d sending MQTT CONNECT request", result);
    return result;
  }
  mqstate(data, MQTT_FIRST, MQTT_CONNACK);
  return CURLE_OK;
}